

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_Constructor_type_prefix_Test::TestBody
          (ElementsAddressFactory_Constructor_type_prefix_Test *this)

{
  bool bVar1;
  NetType NVar2;
  NetType type;
  char *pcVar3;
  CfdException *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  ElementsAddressFactory factory_9;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  ElementsAddressFactory factory_8;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ElementsAddressFactory factory_7;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Address address_1;
  ElementsAddressFactory factory_6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory_5;
  Pubkey pubkey;
  ElementsAddressFactory factory_4;
  ElementsAddressFactory factory_3;
  ElementsAddressFactory factory_2;
  ElementsAddressFactory factory_1;
  ElementsAddressFactory factory;
  Address *in_stack_fffffffffffff410;
  undefined4 in_stack_fffffffffffff418;
  undefined4 uVar4;
  NetType in_stack_fffffffffffff41c;
  ElementsAddressFactory *in_stack_fffffffffffff420;
  undefined4 in_stack_fffffffffffff428;
  undefined4 in_stack_fffffffffffff42c;
  AssertHelper local_ba0;
  Message local_b98 [49];
  byte local_a09;
  ConstCharPtr local_a08 [9];
  AssertHelper local_9c0;
  Message local_9b8 [49];
  byte local_829;
  ConstCharPtr local_828 [9];
  AssertHelper local_7e0;
  Message local_7d8 [49];
  byte local_649;
  ConstCharPtr local_648 [9];
  AssertHelper local_600;
  Message local_5f8;
  undefined4 local_5f0;
  NetType local_5ec;
  AssertionResult local_5e8;
  AssertHelper local_5d8;
  Message local_5d0;
  undefined4 local_5c8;
  NetType local_5c4;
  AssertionResult local_5c0;
  Address local_5b0;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined4 local_3e8;
  WitnessVersion local_3e4;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3c0;
  NetType local_3bc;
  AssertionResult local_3b8;
  Address local_3a8;
  allocator local_1e9;
  string local_1e8;
  Pubkey local_1c8;
  AssertHelper local_1b0;
  Message local_1a8 [9];
  AssertHelper local_160;
  Message local_158 [9];
  AssertHelper local_110;
  Message local_108 [9];
  AssertHelper local_c0;
  Message local_b8 [9];
  AssertHelper local_70;
  Message local_68 [13];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)in_stack_fffffffffffff410);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff420);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f0517);
    }
  }
  else {
    testing::Message::Message(local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x28,
               "Expected: ElementsAddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message((Message *)0x1f05dd);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)in_stack_fffffffffffff410);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff420);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f0693);
    }
  }
  else {
    testing::Message::Message(local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x29,
               "Expected: ElementsAddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x1f0759);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)in_stack_fffffffffffff410);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff420);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f080f);
    }
  }
  else {
    testing::Message::Message(local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2a,
               "Expected: ElementsAddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x1f08d5);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)in_stack_fffffffffffff410);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff420);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f098b);
    }
  }
  else {
    testing::Message::Message(local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2b,
               "Expected: ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x1f0a51);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)in_stack_fffffffffffff410);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff420);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f0b07);
    }
  }
  else {
    testing::Message::Message(local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2c,
               "Expected: ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1b0,local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x1f0bcd);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_1e9);
  cfd::core::Pubkey::Pubkey(&local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff410);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff420);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             (Pubkey *)in_stack_fffffffffffff410);
  local_3bc = cfd::core::Address::GetNetType(&local_3a8);
  local_3c0 = 3;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((char *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
             (char *)in_stack_fffffffffffff420,
             (NetType *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             (NetType *)in_stack_fffffffffffff410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1f0e37);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::Message::~Message((Message *)0x1f0e94);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f0eec);
  local_3e4 = cfd::core::Address::GetWitnessVersion(&local_3a8);
  local_3e8 = 0;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((char *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
             (char *)in_stack_fffffffffffff420,
             (WitnessVersion *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->type_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1f0fab);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    testing::Message::~Message((Message *)0x1f1008);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f1060);
  cfd::core::Address::~Address(in_stack_fffffffffffff410);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f107a);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff410);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff420);
  cfd::AddressFactory::CreateP2pkhAddress
            ((AddressFactory *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             (Pubkey *)in_stack_fffffffffffff410);
  NVar2 = cfd::core::Address::GetNetType(&local_5b0);
  local_5c8 = 4;
  local_5c4 = NVar2;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((char *)CONCAT44(NVar2,in_stack_fffffffffffff428),(char *)in_stack_fffffffffffff420,
             (NetType *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             (NetType *)in_stack_fffffffffffff410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5c0);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff428);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    in_stack_fffffffffffff420 =
         (ElementsAddressFactory *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1f1205);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x38,(char *)in_stack_fffffffffffff420);
    testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_5d8);
    testing::Message::~Message((Message *)0x1f1262);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f12ba);
  type = cfd::core::Address::GetWitnessVersion(&local_5b0);
  local_5f0 = 0xffffffff;
  local_5ec = type;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((char *)CONCAT44(NVar2,uVar4),(char *)in_stack_fffffffffffff420,
             (WitnessVersion *)CONCAT44(type,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->type_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e8);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff418);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    in_stack_fffffffffffff410 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x1f1379);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x39,(char *)in_stack_fffffffffffff410);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    testing::Message::~Message((Message *)0x1f13d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f142e);
  cfd::core::Address::~Address(in_stack_fffffffffffff410);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f1448);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff420,type,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff410);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff420);
  testing::internal::ConstCharPtr::ConstCharPtr(local_648,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_648);
  if (bVar1) {
    local_649 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)CONCAT44(type,uVar4),(Pubkey *)in_stack_fffffffffffff410);
      cfd::core::Address::~Address(in_stack_fffffffffffff410);
    }
    if ((local_649 & 1) == 0) {
      local_648[0].value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f160d;
    }
  }
  else {
LAB_001f160d:
    testing::Message::Message(local_7d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x3f,local_648[0].value);
    testing::internal::AssertHelper::operator=(&local_7e0,local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    testing::Message::~Message((Message *)0x1f1675);
  }
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f16cd);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff420,type,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff410);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff420);
  testing::internal::ConstCharPtr::ConstCharPtr(local_828,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_828);
  if (bVar1) {
    local_829 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)CONCAT44(type,uVar4),(Pubkey *)in_stack_fffffffffffff410);
      cfd::core::Address::~Address(in_stack_fffffffffffff410);
    }
    if ((local_829 & 1) == 0) {
      local_828[0].value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f187b;
    }
  }
  else {
LAB_001f187b:
    testing::Message::Message(local_9b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x43,local_828[0].value);
    testing::internal::AssertHelper::operator=(&local_9c0,local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    testing::Message::~Message((Message *)0x1f18e3);
  }
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f193b);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff420,type,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff410);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff420);
  testing::internal::ConstCharPtr::ConstCharPtr(local_a08,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_a08);
  if (bVar1) {
    local_a09 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)CONCAT44(type,uVar4),(Pubkey *)in_stack_fffffffffffff410);
      cfd::core::Address::~Address(in_stack_fffffffffffff410);
    }
    if ((local_a09 & 1) != 0) goto LAB_001f1b78;
    local_a08[0].value =
         "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_b98);
  testing::internal::AssertHelper::AssertHelper
            (&local_ba0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x47,local_a08[0].value);
  testing::internal::AssertHelper::operator=(&local_ba0,local_b98);
  testing::internal::AssertHelper::~AssertHelper(&local_ba0);
  testing::Message::~Message((Message *)0x1f1b36);
LAB_001f1b78:
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f1b85);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1f1b92);
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kLiquidV1);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kElementsRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    ElementsAddressFactory factory(NetType::kMainnet, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kTestnet, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}